

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O3

void err_throw_current(void)

{
  uint uVar1;
  uint __val;
  long in_FS_OFFSET;
  
  uVar1 = **(uint **)(in_FS_OFFSET + -8);
  __val = uVar1 & 0x8000 | 0x4000;
  if ((uVar1 & 0xffff7fff) == 0) {
    __val = uVar1 | 1;
  }
  longjmp((__jmp_buf_tag *)(*(uint **)(in_FS_OFFSET + -8) + 6),__val);
}

Assistant:

NORETURN static void err_throw_current()
{
    err_state_t new_state;

    /*
     *   Figure out what state the enclosing frame will be in after this
     *   jump.  If we're currently in a 'trying' block, we'll now be in an
     *   'exception' state.  Otherwise, we must have been in a 'catch' or
     *   'finally' already - in these cases, the new state is 'rethrown',
     *   because we have an exception within an exception handler.  
     */
    err_state_t old_state = os_tls_get(err_frame_t *, G_err_frame)->state_;
    err_state_t f = (old_state & ERR_STATE_FINALLY);
    old_state &= ~ERR_STATE_FINALLY;
    if (old_state == ERR_STATE_TRYING)
        new_state = ERR_STATE_EXCEPTION | f;
    else
        new_state = ERR_STATE_RETHROWN | f;

    /* jump to the enclosing frame's exception handler */
    longjmp(os_tls_get(err_frame_t *, G_err_frame)->jmpbuf_, new_state);
}